

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O2

char ** gen_options(uint program)

{
  int iVar1;
  option_type_t oVar2;
  uint uVar3;
  char **ptr;
  char *pcVar4;
  size_t sVar5;
  ushort **ppuVar6;
  option_t *poVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  char buf [4096];
  
  if (program == 0) {
    ptr = (char **)0x0;
  }
  else {
    ptr = (char **)mmalloc(0x10);
    pcVar4 = (char *)mmalloc(5);
    *ptr = pcVar4;
    ptr[1] = (char *)0x0;
    if (program == 1) {
      builtin_strncpy(pcVar4,"gbas",5);
    }
    else {
      builtin_strncpy(pcVar4,"gbld",5);
    }
    uVar9 = 1;
    for (lVar10 = 0; lVar10 != 8; lVar10 = lVar10 + 1) {
      iVar8 = (int)uVar9;
      uVar11 = uVar9;
      if (options[lVar10].set != 0) {
        poVar7 = options + lVar10;
        if (program == 1) {
          iVar1 = options[lVar10].as_opt;
joined_r0x001066fc:
          if (iVar1 == 0) goto LAB_00106899;
        }
        else if (program == 2) {
          iVar1 = options[lVar10].ld_opt;
          goto joined_r0x001066fc;
        }
        uVar12 = (ulong)(iVar8 + 1);
        uVar11 = (ulong)(iVar8 + 2);
        ptr = (char **)mrealloc(ptr,uVar11 * 8);
        ptr[uVar12] = (char *)0x0;
        oVar2 = options[lVar10].type;
        if (oVar2 == string) {
          ptr = (char **)mrealloc(ptr,(ulong)(iVar8 + 3) << 3);
          ptr[uVar11] = (char *)0x0;
          pcVar4 = options[lVar10].value.str;
          sVar5 = strlen(pcVar4);
          uVar3 = 0;
          do {
            uVar13 = (ulong)uVar3;
            if (sVar5 <= uVar13) {
              strcpy(buf,pcVar4);
              goto LAB_00106836;
            }
            ppuVar6 = __ctype_b_loc();
            uVar3 = uVar3 + 1;
          } while ((*(byte *)((long)*ppuVar6 + (long)pcVar4[uVar13] * 2 + 1) & 0x20) == 0);
          sprintf(buf,"\"%s\"",pcVar4);
LAB_00106836:
          sVar5 = strlen(poVar7->name);
          pcVar4 = (char *)mmalloc(sVar5 + 1);
          ptr[uVar9] = pcVar4;
          sVar5 = strlen(buf);
          pcVar4 = (char *)mmalloc(sVar5 + 1);
          ptr[uVar12] = pcVar4;
          strcpy(ptr[uVar9],poVar7->name);
          strcpy(ptr[uVar12],buf);
        }
        else {
          uVar11 = uVar12;
          if (oVar2 == number) {
            sprintf(buf,"%s%d",poVar7->name,(ulong)(uint)options[lVar10].value.num);
            sVar5 = strlen(buf);
            pcVar4 = (char *)mmalloc(sVar5 + 1);
            ptr[uVar9] = pcVar4;
            strcpy(pcVar4,buf);
          }
          else if (oVar2 == flag) {
            sVar5 = strlen(poVar7->name);
            pcVar4 = (char *)mmalloc(sVar5 + 1);
            ptr[uVar9] = pcVar4;
            strcpy(pcVar4,poVar7->name);
          }
        }
      }
LAB_00106899:
      uVar9 = uVar11;
    }
  }
  return ptr;
}

Assistant:

char** gen_options(unsigned program)
{
    unsigned i, num_opts = 1;
    char buf[PATH_MAX];
    
    if (program == GBCC)
        return NULL;
    char** opts = (char**)mmalloc((num_opts+1) * sizeof(char*));
    opts[0] = (char*)mmalloc(5);
    opts[1] = NULL;
    
    if (program == GBAS)
        strcpy(opts[0], "gbas");
    else
        strcpy(opts[0], "gbld");
    
    for (i = 0; i < NUM_OPTIONS; ++i)
    {
        if (!options[i].set)
            continue;
        if (program == GBAS && !options[i].as_opt)
            continue;
        if (program == GBLD && !options[i].ld_opt)
            continue;
        
        opts = (char**)mrealloc(opts, (++num_opts+1) * sizeof(char*));
        opts[num_opts] = NULL;
        
        if (options[i].type == flag)    /* -opt */
        {
            opts[num_opts-1] = (char*)mmalloc(strlen(options[i].name) + 1);
            strcpy(opts[num_opts-1], options[i].name);
        }
        else if (options[i].type == number) /* -opt=<number> */
        {
            sprintf(buf, "%s%d", options[i].name, options[i].value.num);
            opts[num_opts-1] = (char*)mmalloc(strlen(buf) + 1);
            strcpy(opts[num_opts-1], buf);
        }
        else if (options[i].type == string) /* -opt <string> */
        {
            unsigned j;
            int delim = 0;
            
            opts = (char**)mrealloc(opts, (++num_opts+1) * sizeof(char*));
            opts[num_opts] = NULL;
            
            for (j = 0; j < strlen(options[i].value.str); ++j)
            {
                if (isspace(options[i].value.str[j]))
                {
                    delim = 1;
                    break;
                }
            }
            
            if (delim)
                sprintf(buf, "\"%s\"", options[i].value.str);
            else
                strcpy(buf, options[i].value.str);
            
            opts[num_opts-2] = (char*)mmalloc(strlen(options[i].name) + 1);
            opts[num_opts-1] = (char*)mmalloc(strlen(buf) + 1);
            
            strcpy(opts[num_opts-2], options[i].name);
            strcpy(opts[num_opts-1], buf);
        }
    }

    return opts;
}